

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

void test_ctr(ptls_cipher_suite_t *cs,uint8_t *key,size_t key_len,void *iv,size_t iv_len,
             void *expected,size_t expected_len)

{
  ptls_cipher_algorithm_t *algo_00;
  int iVar1;
  ptls_cipher_context_t *ctx_00;
  ptls_cipher_context_t *ctx;
  uint8_t buf [64];
  ptls_cipher_algorithm_t *algo;
  void *expected_local;
  size_t iv_len_local;
  void *iv_local;
  size_t key_len_local;
  uint8_t *key_local;
  ptls_cipher_suite_t *cs_local;
  
  if (cs != (ptls_cipher_suite_t *)0x0) {
    algo_00 = cs->aead->ctr_cipher;
    if (0x40 < expected_len) {
      __assert_fail("expected_len <= sizeof(zeroes)",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c"
                    ,0xf9,
                    "void test_ctr(ptls_cipher_suite_t *, const uint8_t *, size_t, const void *, size_t, const void *, size_t)"
                   );
    }
    _ok((uint)(algo_00->key_size == key_len),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0xfa);
    _ok((uint)(algo_00->iv_size == iv_len),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0xfb);
    ctx_00 = ptls_cipher_new(algo_00,1,key);
    if (ctx_00 == (ptls_cipher_context_t *)0x0) {
      __assert_fail("ctx != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c"
                    ,0xfe,
                    "void test_ctr(ptls_cipher_suite_t *, const uint8_t *, size_t, const void *, size_t, const void *, size_t)"
                   );
    }
    ptls_cipher_init(ctx_00,iv);
    ptls_cipher_encrypt(ctx_00,&ctx,"",expected_len);
    ptls_cipher_free(ctx_00);
    iVar1 = memcmp(&ctx,expected,expected_len);
    _ok((uint)(iVar1 == 0),"%s %d",
        "/workspace/llm4binary/github/license_c_cmakelists/rperper[P]picotls/t/picotls.c",0x103);
  }
  return;
}

Assistant:

static void test_ctr(ptls_cipher_suite_t *cs, const uint8_t *key, size_t key_len, const void *iv, size_t iv_len,
                     const void *expected, size_t expected_len)
{
    static const uint8_t zeroes[64] = {0};

    if (cs == NULL)
        return;

    ptls_cipher_algorithm_t *algo = cs->aead->ctr_cipher;
    uint8_t buf[sizeof(zeroes)];

    assert(expected_len <= sizeof(zeroes));
    ok(algo->key_size == key_len);
    ok(algo->iv_size == iv_len);

    ptls_cipher_context_t *ctx = ptls_cipher_new(algo, 1, key);
    assert(ctx != NULL);
    ptls_cipher_init(ctx, iv);
    ptls_cipher_encrypt(ctx, buf, zeroes, expected_len);
    ptls_cipher_free(ctx);

    ok(memcmp(buf, expected, expected_len) == 0);
}